

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_var::statement_var
          (statement_var *this,tree_type<cs::token_base_*> *tree,context_t *c,bool _l,
          token_base *ptr)

{
  byte in_CL;
  token_base *in_RDX;
  context_t *in_RSI;
  statement_base *in_RDI;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffa8;
  
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RDX,in_stack_ffffffffffffffa8);
  statement_base::statement_base(in_RDI,in_RSI,in_RDX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1bd294);
  in_RDI->_vptr_statement_base = (_func_int **)&PTR__statement_var_003bd4f8;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_RDX,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffffa8);
  *(byte *)&in_RDI[1].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = in_CL & 1;
  return;
}

Assistant:

statement_var(tree_type<token_base *> tree, context_t c, bool _l, token_base *ptr) : statement_base(
			    std::move(c), ptr), link(_l),
			mTree(std::move(tree)) {}